

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  char *pcVar7;
  ImGuiContext *g;
  char *pcVar8;
  char *pcVar9;
  
  pIVar5 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if (text_end == (char *)0x0) {
    text_end = ImGui::FindRenderedTextEnd(text,(char *)0x0);
  }
  fVar1 = ref_pos->y;
  fVar2 = (pIVar4->DC).LogLinePosY;
  (pIVar4->DC).LogLinePosY = fVar1;
  iVar6 = pIVar5->LogStartDepth;
  iVar3 = (pIVar4->DC).TreeDepth;
  if (iVar3 < iVar6) {
    pIVar5->LogStartDepth = iVar3;
    iVar6 = iVar3;
  }
  pcVar8 = text;
  pcVar7 = text;
LAB_0011b5ff:
  do {
    if (pcVar8 < text_end) {
      pcVar9 = pcVar8;
      if (*pcVar8 != '\n') {
        pcVar8 = pcVar8 + 1;
        goto LAB_0011b5ff;
      }
    }
    else {
      pcVar9 = (char *)0x0;
    }
    pcVar8 = pcVar9;
    if (pcVar9 == (char *)0x0) {
      pcVar8 = text_end;
    }
    if ((pcVar8 != pcVar7 || pcVar9 != (char *)0x0) && pcVar8 != (char *)0x0) {
      if ((fVar2 + 1.0 < fVar1) || (pcVar7 != text)) {
        ImGui::LogText("\n%*s%.*s",(ulong)(uint)((iVar3 - iVar6) * 4),"");
      }
      else {
        ImGui::LogText(" %.*s",(ulong)(uint)((int)pcVar8 - (int)pcVar7),pcVar7);
      }
    }
    pcVar8 = pcVar8 + 1;
    pcVar7 = pcVar8;
    if (pcVar9 == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void LogRenderedText(const ImVec2& ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = ImGui::GetCurrentWindowRead();

    if (!text_end)
        text_end = ImGui::FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos.y > window->DC.LogLinePosY+1;
    window->DC.LogLinePosY = ref_pos.y;

    const char* text_remaining = text;
    if (g.LogStartDepth > window->DC.TreeDepth)  // Re-adjust padding if we have popped out of our starting depth
        g.LogStartDepth = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogStartDepth);
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by spacing corresponding to the current depth of our log entry.
        const char* line_end = text_remaining;
        while (line_end < text_end)
            if (*line_end == '\n')
                break;
            else
                line_end++;
        if (line_end >= text_end)
            line_end = NULL;

        const bool is_first_line = (text == text_remaining);
        bool is_last_line = false;
        if (line_end == NULL)
        {
            is_last_line = true;
            line_end = text_end;
        }
        if (line_end != NULL && !(is_last_line && (line_end - text_remaining)==0))
        {
            const int char_count = (int)(line_end - text_remaining);
            if (log_new_line || !is_first_line)
                ImGui::LogText(IM_NEWLINE "%*s%.*s", tree_depth*4, "", char_count, text_remaining);
            else
                ImGui::LogText(" %.*s", char_count, text_remaining);
        }

        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }
}